

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue-C-API.cpp
# Opt level: O3

llb_build_value_file_info_t * llbuild::capi::convertFileInfo(FileInfo *fileInfo)

{
  uint64_t uVar1;
  llb_build_value_file_info_t *in_RDI;
  
  uVar1 = fileInfo->inode;
  in_RDI->device = fileInfo->device;
  in_RDI->inode = uVar1;
  uVar1 = fileInfo->size;
  in_RDI->mode = fileInfo->mode;
  in_RDI->size = uVar1;
  uVar1 = (fileInfo->modTime).nanoseconds;
  (in_RDI->modTime).seconds = (fileInfo->modTime).seconds;
  (in_RDI->modTime).nanoseconds = uVar1;
  return in_RDI;
}

Assistant:

const llb_build_value_file_info_t llbuild::capi::convertFileInfo(const basic::FileInfo &fileInfo) {
  return llb_build_value_file_info_t {
    fileInfo.device,
    fileInfo.inode,
    fileInfo.mode,
    fileInfo.size,
    llb_build_value_file_timestamp_t {
      fileInfo.modTime.seconds,
      fileInfo.modTime.nanoseconds,
    },
  };
}